

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_b16c(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  double a1;
  double a;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  if (in->a < 1) {
    out->r = back->ir;
    out->g = back->ig;
    out->b = back->ib;
  }
  else {
    dVar2 = (double)in->a / 65535.0;
    dVar3 = 1.0 - dVar2;
    dVar2 = dVar2 / 65535.0;
    bVar1 = sRGB((double)in->r * dVar2 + back->dr * dVar3);
    out->r = (uint)bVar1;
    bVar1 = sRGB((double)in->g * dVar2 + back->dg * dVar3);
    out->g = (uint)bVar1;
    bVar1 = sRGB((double)in->b * dVar2 + back->db * dVar3);
    out->b = (uint)bVar1;
  }
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_b16c(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else
   {
      double a = in->a/65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = sRGB(in->r * a + back->dr * a1);
      out->g = sRGB(in->g * a + back->dg * a1);
      out->b = sRGB(in->b * a + back->db * a1);
   }

   out->a = 255;
}